

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O3

wchar_t get_monster_brand_multiplier(monster_conflict *mon,brand_conflict *b,_Bool is_o_combat)

{
  wchar_t wVar1;
  _Bool _Var2;
  undefined7 in_register_00000011;
  wchar_t wVar3;
  
  wVar1 = (&b->multiplier)[CONCAT71(in_register_00000011,is_o_combat) & 0xffffffff];
  wVar3 = wVar1;
  if (b->vuln_flag != 0) {
    _Var2 = flag_has_dbg(mon->race->flags,0xb,b->vuln_flag,"mon->race->flags","b->vuln_flag");
    if (_Var2) {
      wVar3 = wVar1 * 2 + L'\xfffffff6';
      if (!is_o_combat) {
        wVar3 = wVar1 * 2;
      }
    }
  }
  return wVar3;
}

Assistant:

int get_monster_brand_multiplier(const struct monster *mon,
		const struct brand *b, bool is_o_combat)
{
	int mult = (is_o_combat) ? b->o_multiplier : b->multiplier;

	if (b->vuln_flag && rf_has(mon->race->flags, b->vuln_flag)) {
		/*
		 * If especially vulnerable, apply a factor of two to the
		 * extra damage from the brand.
		 */
		if (is_o_combat) {
			mult = 2 * (mult - 10) + 10;
		} else {
			mult *= 2;
		}
	}

	return mult;
}